

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O2

yajl_val value_alloc(yajl_type type)

{
  yajl_val pyVar1;
  
  pyVar1 = (yajl_val)calloc(1,0x28);
  if (pyVar1 != (yajl_val)0x0) {
    pyVar1->type = type;
  }
  return pyVar1;
}

Assistant:

static yajl_val value_alloc (yajl_type type)
{
    yajl_val v;

    v = malloc (sizeof (*v));
    if (v == NULL) return (NULL);
    memset (v, 0, sizeof (*v));
    v->type = type;

    return (v);
}